

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakCallback.h
# Opt level: O0

WeakCallback<sznet::net::TcpConnection> * __thiscall
sznet::makeWeakCallback<sznet::net::TcpConnection>
          (WeakCallback<sznet::net::TcpConnection> *__return_storage_ptr__,sznet *this,
          shared_ptr<sznet::net::TcpConnection> *object,offset_in_TcpConnection_to_subr function)

{
  function<void_(sznet::net::TcpConnection_*)> local_68;
  weak_ptr<sznet::net::TcpConnection> local_48;
  shared_ptr<sznet::net::TcpConnection> *local_38;
  offset_in_TcpConnection_to_subr function_local;
  sznet *local_28;
  shared_ptr<sznet::net::TcpConnection> *object_local;
  offset_in_TcpConnection_to_subr local_18;
  WeakCallback<sznet::net::TcpConnection> *local_10;
  
  local_38 = object;
  function_local = function;
  local_28 = this;
  object_local = object;
  local_18 = function;
  local_10 = __return_storage_ptr__;
  std::weak_ptr<sznet::net::TcpConnection>::weak_ptr<sznet::net::TcpConnection,void>
            (&local_48,(shared_ptr<sznet::net::TcpConnection> *)this);
  std::function<void(sznet::net::TcpConnection*)>::
  function<void(sznet::net::TcpConnection::*&)(),void>
            ((function<void(sznet::net::TcpConnection*)> *)&local_68,
             (offset_in_TcpConnection_to_subr *)&local_38);
  WeakCallback<sznet::net::TcpConnection>::WeakCallback(__return_storage_ptr__,&local_48,&local_68);
  std::function<void_(sznet::net::TcpConnection_*)>::~function(&local_68);
  std::weak_ptr<sznet::net::TcpConnection>::~weak_ptr(&local_48);
  return __return_storage_ptr__;
}

Assistant:

WeakCallback<CLASS, ARGS...> makeWeakCallback(const std::shared_ptr<CLASS>& object, void (CLASS::*function)(ARGS...))
{
	return WeakCallback<CLASS, ARGS...>(object, function);
}